

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O3

type * __thiscall
Disa::projection_orthogonal<double,0ul,0ul>
          (type *__return_storage_ptr__,Disa *this,Vector_Dense<double,_0UL> *vector_0,
          Vector_Dense<double,_0UL> *vector_1)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _return_vector vector;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  Vector_Dense<double,_0UL> local_e8;
  undefined8 uStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined **local_28;
  
  if (*(long *)(this + 8) - *(long *)this ==
      (long)(vector_0->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(vector_0->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start) {
    local_108._8_8_ = 0;
    local_f0 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_operators.hpp:186:25)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_operators.hpp:186:25)>
               ::_M_manager;
    local_108._M_unused._0_8_ = (undefined8)this;
    Vector_Dense<double,_0UL>::Vector_Dense
              (&local_e8,(function<double_(unsigned_long)> *)&local_108,
               *(long *)(this + 8) - *(long *)this >> 3);
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,3);
    }
    projection_tangent<double,0ul,0ul>((type *)&local_108,this,vector_0,vector_1);
    operator-(__return_storage_ptr__,&local_e8,(Vector_Dense<double,_0UL> *)&local_108);
    if ((Disa *)local_108._M_unused._0_8_ != (Disa *)0x0) {
      operator_delete(local_108._M_unused._M_object,(long)local_f8 - local_108._0_8_);
    }
    if (local_e8.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(local_e8.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_28 = &PTR_s__workspace_llm4binary_github_lic_00161978;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
             (Disa *)0x0,(Log_Level)&local_28,(source_location *)vector_1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_108._M_unused._0_8_,local_108._8_8_);
  std::__cxx11::to_string(&local_88,*(long *)(this + 8) - *(long *)this >> 3);
  std::operator+(&local_68,"Incompatible vector sizes, ",&local_88);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68," vs. ");
  local_c8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar3) {
    local_c8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_c8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string
            (&local_a8,
             (long)(vector_0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector_0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_48,&local_c8,&local_a8);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_48,".");
  local_e8.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start == paVar3) {
    local_e8.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)paVar3->_M_allocated_capacity;
    uStack_d0 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_e8.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_e8.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_e8.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)paVar3->_M_allocated_capacity;
  }
  local_e8.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)local_e8.super_vector<double,_std::allocator<double>_>.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start,
                      (long)local_e8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  exit(1);
}

Assistant:

constexpr typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type
projection_orthogonal(const Vector_Dense<_type, _size_0>& vector_0, const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  _return_vector vector([&](const std::size_t index) { return vector_0[index]; }, vector_1.size());
  return vector - projection_tangent(vector_0, vector_1);
}